

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_get_upsampled_plane_size(AV1_COMMON *cm,int is_uv,int *plane_w,int *plane_h)

{
  bool local_2a;
  bool local_29;
  int ss_y;
  int ss_x;
  int *plane_h_local;
  int *plane_w_local;
  int is_uv_local;
  AV1_COMMON *cm_local;
  
  local_29 = false;
  if (is_uv != 0) {
    local_29 = cm->seq_params->subsampling_x != 0;
  }
  local_2a = false;
  if (is_uv != 0) {
    local_2a = cm->seq_params->subsampling_y != 0;
  }
  *plane_w = cm->superres_upscaled_width + ((1 << local_29) >> 1) >> local_29;
  *plane_h = cm->height + ((1 << local_2a) >> 1) >> local_2a;
  return;
}

Assistant:

void av1_get_upsampled_plane_size(const AV1_COMMON *cm, int is_uv, int *plane_w,
                                  int *plane_h) {
  int ss_x = is_uv && cm->seq_params->subsampling_x;
  int ss_y = is_uv && cm->seq_params->subsampling_y;
  *plane_w = ROUND_POWER_OF_TWO(cm->superres_upscaled_width, ss_x);
  *plane_h = ROUND_POWER_OF_TWO(cm->height, ss_y);
}